

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst-timerfd.c
# Opt level: O0

void * th2_func(void *arg)

{
  int __fd;
  ssize_t sVar1;
  int64_t iVar2;
  timespec begin;
  timespec end;
  timespec after;
  timespec before;
  uint64_t counter2;
  int fd;
  void *arg_local;
  
  __fd = *arg;
  begin = steady_clock_now();
  sVar1 = read(__fd,&before.tv_nsec,8);
  if (sVar1 != 8) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(ssize_t)8",
            "read(fd, &counter2, sizeof(counter2))",
            "/workspace/llm4binary/github/license_all_cmakelists_25/owl-compositor[P]epoll-shim/test/tst-timerfd.c"
            ,0x93);
    abort();
  }
  if (before.tv_nsec != 1) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(u64)1","counter2",
            "/workspace/llm4binary/github/license_all_cmakelists_25/owl-compositor[P]epoll-shim/test/tst-timerfd.c"
            ,0x94);
    abort();
  }
  end = steady_clock_now();
  iVar2 = nano_diff(end,begin);
  if (iVar2 < 500000000) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(int64_t)MS_TO_NSEC(500)",
            "nano_diff(after, before)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/owl-compositor[P]epoll-shim/test/tst-timerfd.c"
            ,0x96);
    abort();
  }
  return (void *)0x0;
}

Assistant:

static void *
th2_func(void *arg)
{
	int fd = *(int *)arg;
	u64 counter2;
	struct timespec before = steady_clock_now();
	expect(read(fd, &counter2, sizeof(counter2)), (ssize_t)8);
	expect(counter2, (u64)1);
	struct timespec after = steady_clock_now();
	expectge(nano_diff(after, before), (int64_t)MS_TO_NSEC(500));
	return NULL;
}